

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s-hierarchy-trainer.cc
# Opt level: O0

void ReadSentencePair(string *line,vector<int,_std::allocator<int>_> *s,Dict *sd,
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *c,Dict *cd,
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *l,Dict *ld,int *unk,int *total)

{
  bool bVar1;
  byte bVar2;
  __type _Var3;
  ulong uVar4;
  char *pcVar5;
  vector<int,_std::allocator<int>_> *in_RSI;
  undefined8 in_RDI;
  string *in_R9;
  int *in_stack_00000010;
  int *in_stack_00000018;
  int k;
  uint i;
  vector<int,_std::allocator<int>_> ctmp;
  int f;
  string sep;
  string word;
  istringstream in;
  value_type_conflict *in_stack_fffffffffffffd48;
  reference in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd58;
  int in_stack_fffffffffffffd5c;
  string *in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd6c;
  int in_stack_fffffffffffffd70;
  int in_stack_fffffffffffffd74;
  int in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  Dict *in_stack_fffffffffffffdb8;
  uint local_224;
  int local_208;
  allocator local_1f1;
  string local_1f0 [32];
  string local_1d0 [32];
  long local_1b0 [48];
  string *local_30;
  vector<int,_std::allocator<int>_> *local_10;
  
  local_30 = in_R9;
  local_10 = in_RSI;
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,in_RDI,8);
  std::__cxx11::string::string(local_1d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"|||",&local_1f1);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  local_208 = 0;
  while (bVar1 = std::ios::operator_cast_to_bool
                           ((ios *)((long)local_1b0 + *(long *)(local_1b0[0] + -0x18))), bVar1) {
    std::operator>>((istream *)local_1b0,local_1d0);
    bVar2 = std::ios::operator!((ios *)((long)local_1b0 + *(long *)(local_1b0[0] + -0x18)));
    if ((bVar2 & 1) != 0) break;
    _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    if (_Var3) {
      local_208 = local_208 + 1;
    }
    else if (local_208 == 0) {
      *in_stack_00000018 = *in_stack_00000018 + 1;
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x389b56);
      for (local_224 = 0; uVar4 = std::__cxx11::string::size(), local_224 < uVar4;
          local_224 = local_224 + 1) {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_1d0);
        in_stack_fffffffffffffd74 = (int)*pcVar5;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&stack0xfffffffffffffdb8,1,(char)in_stack_fffffffffffffd74,
                   (allocator *)&stack0xfffffffffffffdb7);
        in_stack_fffffffffffffd70 =
             cnn::Dict::Convert(in_stack_fffffffffffffdb8,
                                (string *)
                                CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
        std::vector<int,_std::allocator<int>_>::push_back
                  (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffdb8);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdb7);
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)in_stack_fffffffffffffd60,
                  (value_type *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      normalize_digital_lower(in_stack_fffffffffffffd60);
      in_stack_fffffffffffffd6c =
           cnn::Dict::Convert(in_stack_fffffffffffffdb8,
                              (string *)
                              CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
      if (in_stack_fffffffffffffd6c == kUNK) {
        *in_stack_00000010 = *in_stack_00000010 + 1;
      }
      in_stack_fffffffffffffdb0 = in_stack_fffffffffffffd6c;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd60,
                 (value_type_conflict *)
                 CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd60);
    }
    else {
      if (local_208 == 1) {
        in_stack_fffffffffffffd60 = local_30;
        std::vector<int,_std::allocator<int>_>::size(local_10);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                 CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      }
      in_stack_fffffffffffffd50 =
           std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         *)local_30,(long)(local_208 + -1));
      in_stack_fffffffffffffd5c =
           cnn::Dict::Convert(in_stack_fffffffffffffdb8,
                              (string *)
                              CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
      std::vector<int,_std::allocator<int>_>::push_back
                (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    }
  }
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
  return;
}

Assistant:

void ReadSentencePair(const string& line, vector<int>* s, cnn::Dict* sd, vector< vector<int> >* c, cnn::Dict* cd, vector< vector<int> >& l, cnn::Dict* ld, int& unk, int& total){
  istringstream in(line);
  string word;
  string sep = "|||";
  int f = 0;

  while(in) {
    in >> word;
    if (!in) break;

    if (word == sep) { f+=1; continue; }
    
    if(f == 0) {
      total += 1;
      vector<int> ctmp;
      for(unsigned i = 0; i < word.size(); i ++){
        ctmp.push_back(cd->Convert(string(1,word[i])));
      }
      c->push_back(ctmp);
      normalize_digital_lower(word);
      int k = sd->Convert(word);
      if(k == kUNK) unk++;
      s->push_back(k);
    }
    else {
      if(f == 1) l.resize(s->size());
      l[f-1].push_back(ld->Convert(word));
    }
  }
}